

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageInstanceImages::uploadImage
          (ImageInstanceImages *this,DeviceInterface *vki,VkDevice device,deUint32 queueFamilyIndex,
          VkQueue queue,Allocator *allocator,VkImage image,VkImageLayout layout,
          TextureLevelPyramid *data)

{
  uint uVar1;
  VkImageViewType VVar2;
  pointer pPVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  VkResult VVar8;
  ulong uVar9;
  int iVar10;
  int sliceNdx;
  undefined4 uVar11;
  ulong uVar12;
  VkImageViewType VVar13;
  deUint32 dataSize;
  uint uVar14;
  ulong size;
  long lVar15;
  uint uVar16;
  int iVar17;
  int level;
  long lVar18;
  RefBase<vk::VkCommandBuffer_s_*> local_2e8;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> dataBufferMemory;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copySlices;
  VkSubmitInfo submitInfo;
  ConstPixelBufferAccess srcAccess;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_208;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  VkDevice local_1d8;
  VkAllocationCallbacks *pVStack_1d0;
  void *local_1c8;
  deUint64 local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_198;
  undefined4 local_170 [2];
  undefined8 local_168;
  undefined8 local_160;
  undefined4 local_158;
  VkImageLayout local_154;
  undefined8 local_150;
  deUint64 local_148;
  undefined8 local_140;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_128;
  undefined4 local_100 [2];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  TextureFormat local_e0;
  undefined8 local_d8;
  ulong local_d0;
  VkCommandBufferBeginInfo cmdBufBeginInfo;
  PixelBufferAccess dstAccess;
  VkCommandPoolCreateInfo cmdPoolCreateInfo;
  VkBufferCreateInfo bufferCreateInfo;
  
  VVar2 = this->m_viewType;
  if (VVar2 == VK_IMAGE_VIEW_TYPE_3D) {
    uVar11 = 1;
  }
  else {
    uVar11 = 0xc;
    if ((VVar2 != VK_IMAGE_VIEW_TYPE_CUBE) && (VVar2 != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)) {
      uVar11 = 2;
    }
  }
  lVar15 = 0;
  uVar14 = 0;
  for (lVar18 = 0;
      pPVar3 = (data->m_access).
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar18 < (int)(((long)(data->m_access).
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x28);
      lVar18 = lVar18 + 1) {
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_1e8,
               (ConstPixelBufferAccess *)
               ((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar15 + -8));
    iVar10 = uStack_1e0._4_4_ * (int)uStack_1e0 * (int)local_1d8;
    iVar6 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_1e8);
    uVar14 = uVar14 + iVar6 * iVar10;
    lVar15 = lVar15 + 0x28;
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  size = (ulong)uVar14;
  bufferCreateInfo.usage = 1;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  bufferCreateInfo.size = size;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1e8,vki,device,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  local_208.m_data.deleter.m_device = local_1d8;
  local_208.m_data.deleter.m_allocator = pVStack_1d0;
  local_208.m_data.object.m_internal = (deUint64)local_1e8;
  local_208.m_data.deleter.m_deviceIface = uStack_1e0;
  local_1e8._0_4_ = R;
  local_1e8._4_4_ = SNORM_INT8;
  uStack_1e0 = (DeviceInterface *)0x0;
  local_1d8 = (VkDevice)0x0;
  pVStack_1d0 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_1e8);
  allocateAndBindObjectMemory
            (&dataBufferMemory,vki,device,allocator,(VkBuffer)local_208.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  local_100[0] = 0x2c;
  local_f8 = 0;
  local_f0 = 0x80000004000;
  uStack_e8 = 0xffffffffffffffff;
  local_e0.order = (undefined4)local_208.m_data.object.m_internal;
  local_e0.type = local_208.m_data.object.m_internal._4_4_;
  local_d8 = 0;
  local_170[0] = 0x2d;
  local_1e8._0_4_ = 0x2d;
  uStack_1e0 = (DeviceInterface *)0x0;
  local_1d8 = (VkDevice)0x100000000000;
  pVStack_1d0 = (VkAllocationCallbacks *)0x700000000;
  local_1c8 = (void *)0xffffffffffffffff;
  local_1c0 = image.m_internal;
  local_1b8 = 1;
  local_1b0 = (undefined4)
              (((long)(data->m_access).
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(data->m_access).
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  local_1ac = 0;
  local_168 = 0;
  local_160 = 0x2000001000;
  local_158 = 7;
  local_154 = layout;
  local_150 = 0xffffffffffffffff;
  local_148 = image.m_internal;
  local_140 = 1;
  local_134 = 0;
  cmdPoolCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolCreateInfo.pNext = (void *)0x0;
  cmdPoolCreateInfo.flags = 1;
  local_1a8 = uVar11;
  local_138 = local_1b0;
  local_130 = uVar11;
  local_d0 = size;
  cmdPoolCreateInfo.queueFamilyIndex = queueFamilyIndex;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vki,device,&cmdPoolCreateInfo,
             (VkAllocationCallbacks *)0x0);
  local_128.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_128.m_data.object.m_internal = submitInfo._0_8_;
  local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  cmdBufBeginInfo.flags = 1;
  cmdBufBeginInfo._20_4_ = 0;
  cmdBufBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufBeginInfo._4_4_ = 0;
  cmdBufBeginInfo.pNext = (void *)0x0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vki,device,
             (VkCommandPool)local_128.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_2e8.m_data.deleter.m_pool.m_internal =
       CONCAT44(submitInfo.pWaitSemaphores._4_4_,(int)submitInfo.pWaitSemaphores);
  local_2e8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_2e8.m_data.object = (VkCommandBuffer_s *)submitInfo._0_8_;
  local_2e8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&submitInfo);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vki,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_198.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(submitInfo.pWaitSemaphores._4_4_,(int)submitInfo.pWaitSemaphores);
  local_198.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_198.m_data.object.m_internal = submitInfo._0_8_;
  local_198.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&submitInfo);
  copySlices.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copySlices.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  copySlices.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar2 = this->m_viewType;
  VVar13 = VVar2 & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY;
  if (VVar13 == VK_IMAGE_VIEW_TYPE_1D) {
    uVar14 = (((data->m_access).
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).m_size.
             m_data[1];
    goto LAB_0053fddf;
  }
  if (VVar13 != VK_IMAGE_VIEW_TYPE_2D) {
    if (VVar2 == VK_IMAGE_VIEW_TYPE_3D) {
      uVar14 = 1;
      goto LAB_0053fddf;
    }
    if ((VVar2 != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) && (VVar2 != VK_IMAGE_VIEW_TYPE_CUBE)) {
      uVar14 = 0;
      goto LAB_0053fddf;
    }
  }
  uVar14 = (((data->m_access).
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).m_size.m_data
           [2];
LAB_0053fddf:
  pvVar4 = (dataBufferMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
            m_data.ptr)->m_hostPtr;
  lVar15 = 0;
  uVar9 = 0;
  if (0 < (int)uVar14) {
    uVar9 = (ulong)uVar14;
  }
  uVar1 = 0;
  while( true ) {
    pPVar3 = (data->m_access).
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(data->m_access).
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x28) <= lVar15)
    break;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&srcAccess,&pPVar3[lVar15].super_ConstPixelBufferAccess);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&dstAccess,&srcAccess.m_format,&srcAccess.m_size,&srcAccess.m_pitch,
               (void *)((long)pvVar4 + (ulong)uVar1));
    iVar5 = srcAccess.m_size.m_data[2];
    iVar17 = srcAccess.m_size.m_data[1];
    iVar6 = srcAccess.m_size.m_data[0];
    iVar7 = tcu::TextureFormat::getPixelSize(&srcAccess.m_format);
    iVar10 = srcAccess.m_size.m_data[0];
    uVar16 = iVar5 * iVar7 * iVar17 * iVar6;
    iVar6 = 1;
    if (VVar13 != VK_IMAGE_VIEW_TYPE_1D) {
      iVar6 = srcAccess.m_size.m_data[1];
    }
    iVar17 = 1;
    if (VVar2 == VK_IMAGE_VIEW_TYPE_3D) {
      iVar17 = srcAccess.m_size.m_data[2];
    }
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      submitInfo.pWaitSemaphores._0_4_ = (int)uVar12;
      submitInfo._0_8_ = (ulong)((uVar16 / uVar14) * (int)submitInfo.pWaitSemaphores) + (ulong)uVar1
      ;
      submitInfo.pNext = (void *)CONCAT44(iVar6,iVar10);
      submitInfo._20_4_ = (int)lVar15;
      submitInfo.waitSemaphoreCount = 1;
      submitInfo.pWaitSemaphores._4_4_ = 1;
      submitInfo.pWaitDstStageMask._0_4_ = 0;
      submitInfo.pWaitDstStageMask._4_4_ = 0;
      submitInfo.commandBufferCount = 0;
      submitInfo._44_4_ = iVar10;
      submitInfo.pCommandBuffers = (VkCommandBuffer *)CONCAT44(iVar17,iVar6);
      std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::push_back
                (&copySlices,(value_type *)&submitInfo);
    }
    tcu::copy((EVP_PKEY_CTX *)&dstAccess,(EVP_PKEY_CTX *)&srcAccess);
    uVar1 = uVar1 + uVar16;
    lVar15 = lVar15 + 1;
  }
  ::vk::flushMappedMemoryRange
            (vki,device,
             (VkDeviceMemory)
             ((dataBufferMemory.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (dataBufferMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.ptr)->m_offset,size);
  VVar8 = (*vki->_vptr_DeviceInterface[0x49])(vki,local_2e8.m_data.object,&cmdBufBeginInfo);
  ::vk::checkResult(VVar8,"vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe2b);
  (*vki->_vptr_DeviceInterface[0x6d])
            (vki,local_2e8.m_data.object,1,0x1000,0,0,0,1,local_100,1,local_1e8);
  (*vki->_vptr_DeviceInterface[0x62])
            (vki,local_2e8.m_data.object,local_208.m_data.object.m_internal,image.m_internal,7,
             ((long)copySlices.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)copySlices.
                   super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,
             copySlices.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (*vki->_vptr_DeviceInterface[0x6d])(vki,local_2e8.m_data.object,0x1000,1,0,0,0,0,0,1,local_170);
  VVar8 = (*vki->_vptr_DeviceInterface[0x4a])(vki,local_2e8.m_data.object);
  ::vk::checkResult(VVar8,"vki.endCommandBuffer(*cmd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe35);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask._0_4_ = 0;
  submitInfo.pWaitDstStageMask._4_4_ = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_2e8;
  VVar8 = (*vki->_vptr_DeviceInterface[2])
                    (vki,queue,1,&submitInfo,local_198.m_data.object.m_internal);
  ::vk::checkResult(VVar8,"vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe45);
  VVar8 = (*vki->_vptr_DeviceInterface[0x16])(vki,device,1,&local_198,0,0xffffffffffffffff);
  ::vk::checkResult(VVar8,
                    "vki.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe47);
  std::_Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::~_Vector_base
            (&copySlices.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_198);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_2e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_128);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&dataBufferMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
            );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_208);
  return;
}

Assistant:

void ImageInstanceImages::uploadImage (const vk::DeviceInterface&		vki,
									   vk::VkDevice						device,
									   deUint32							queueFamilyIndex,
									   vk::VkQueue						queue,
									   vk::Allocator&					allocator,
									   vk::VkImage						image,
									   vk::VkImageLayout				layout,
									   const tcu::TextureLevelPyramid&	data)
{
	const deUint32						arraySize					= (m_viewType == vk::VK_IMAGE_VIEW_TYPE_3D) ? (1) :
																	  (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE || m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) ? (6 * (deUint32)ARRAY_SIZE) :
																	  ((deUint32)ARRAY_SIZE);
	const deUint32						dataBufferSize				= getTextureLevelPyramidDataSize(data);
	const vk::VkBufferCreateInfo		bufferCreateInfo			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
		DE_NULL,
		0u,													// flags
		dataBufferSize,										// size
		vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT,				// usage
		vk::VK_SHARING_MODE_EXCLUSIVE,						// sharingMode
		0u,													// queueFamilyCount
		DE_NULL,											// pQueueFamilyIndices
	};
	const vk::Unique<vk::VkBuffer>		dataBuffer					(vk::createBuffer(vki, device, &bufferCreateInfo));
	const de::MovePtr<vk::Allocation>	dataBufferMemory			= allocateAndBindObjectMemory(vki, device, allocator, *dataBuffer, vk::MemoryRequirement::HostVisible);
	const vk::VkBufferMemoryBarrier		preMemoryBarrier			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
		DE_NULL,
		vk::VK_ACCESS_HOST_WRITE_BIT,						// outputMask
		vk::VK_ACCESS_TRANSFER_READ_BIT,					// inputMask
		VK_QUEUE_FAMILY_IGNORED,							// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,							// destQueueFamilyIndex
		*dataBuffer,										// buffer
		0u,													// offset
		dataBufferSize,										// size
	};
	const vk::VkImageSubresourceRange	fullSubrange				=
	{
		vk::VK_IMAGE_ASPECT_COLOR_BIT,						// aspectMask
		0u,													// baseMipLevel
		(deUint32)data.getNumLevels(),						// mipLevels
		0u,													// baseArraySlice
		arraySize,											// arraySize
	};
	const vk::VkImageMemoryBarrier		preImageBarrier				=
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,
		0u,													// outputMask
		vk::VK_ACCESS_TRANSFER_WRITE_BIT,					// inputMask
		vk::VK_IMAGE_LAYOUT_UNDEFINED,						// oldLayout
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// newLayout
		VK_QUEUE_FAMILY_IGNORED,							// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,							// destQueueFamilyIndex
		image,												// image
		fullSubrange										// subresourceRange
	};
	const vk::VkImageMemoryBarrier		postImageBarrier			=
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,
		vk::VK_ACCESS_TRANSFER_WRITE_BIT,					// outputMask
		vk::VK_ACCESS_SHADER_READ_BIT,						// inputMask
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// oldLayout
		layout,												// newLayout
		VK_QUEUE_FAMILY_IGNORED,							// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,							// destQueueFamilyIndex
		image,												// image
		fullSubrange										// subresourceRange
	};
	const vk::VkCommandPoolCreateInfo		cmdPoolCreateInfo			=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
		DE_NULL,
		vk::VK_COMMAND_POOL_CREATE_TRANSIENT_BIT,			// flags
		queueFamilyIndex,									// queueFamilyIndex
	};
	const vk::Unique<vk::VkCommandPool>		cmdPool						(vk::createCommandPool(vki, device, &cmdPoolCreateInfo));
	const vk::VkCommandBufferBeginInfo		cmdBufBeginInfo				=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		vk::VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// flags
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const vk::Unique<vk::VkCommandBuffer>	cmd							(vk::allocateCommandBuffer(vki, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vk::Unique<vk::VkFence>			cmdCompleteFence			(vk::createFence(vki, device));
	const deUint64							infiniteTimeout				= ~(deUint64)0u;
	std::vector<vk::VkBufferImageCopy>		copySlices;

	// copy data to buffer
	writeTextureLevelPyramidData(dataBufferMemory->getHostPtr(), dataBufferSize, data, m_viewType , &copySlices);
	flushMappedMemoryRange(vki, device, dataBufferMemory->getMemory(), dataBufferMemory->getOffset(), dataBufferSize);

	// record command buffer
	VK_CHECK(vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo));
	vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0,
						   0, (const vk::VkMemoryBarrier*)DE_NULL,
						   1, &preMemoryBarrier,
						   1, &preImageBarrier);
	vki.cmdCopyBufferToImage(*cmd, *dataBuffer, image, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copySlices.size(), &copySlices[0]);
	vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
						   0, (const vk::VkMemoryBarrier*)DE_NULL,
						   0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
						   1, &postImageBarrier);
	VK_CHECK(vki.endCommandBuffer(*cmd));

	// submit and wait for command buffer to complete before killing it
	{
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
			DE_NULL,
			0u,
			(const vk::VkSemaphore*)0,
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,
			&cmd.get(),
			0u,
			(const vk::VkSemaphore*)0,
		};
		VK_CHECK(vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence));
	}
	VK_CHECK(vki.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)); // \note: timeout is failure
}